

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O0

int X509_LOOKUP_ctrl(X509_LOOKUP *ctx,int cmd,char *argc,long argl,char **ret)

{
  long lVar1;
  char **ret_local;
  long argl_local;
  char *argc_local;
  int cmd_local;
  X509_LOOKUP *ctx_local;
  
  lVar1._0_4_ = ctx->init;
  lVar1._4_4_ = ctx->skip;
  if (lVar1 == 0) {
    ctx_local._4_4_ = -1;
  }
  else if (*(long *)(*(long *)ctx + 0x10) == 0) {
    ctx_local._4_4_ = 1;
  }
  else {
    ctx_local._4_4_ = (**(code **)(*(long *)ctx + 0x10))(ctx,cmd,argc,argl,ret);
  }
  return ctx_local._4_4_;
}

Assistant:

int X509_LOOKUP_ctrl(X509_LOOKUP *ctx, int cmd, const char *argc, long argl,
                     char **ret) {
  if (ctx->method == NULL) {
    return -1;
  }
  if (ctx->method->ctrl != NULL) {
    return ctx->method->ctrl(ctx, cmd, argc, argl, ret);
  } else {
    return 1;
  }
}